

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

int __thiscall
Centaurus::CATNMachine<unsigned_char>::import_literal_terminal
          (CATNMachine<unsigned_char> *this,
          basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
          *literal,int origin,int tag)

{
  byte bVar1;
  pointer puVar2;
  size_type sVar3;
  size_type sVar4;
  CharClass<unsigned_char> local_50;
  
  puVar2 = (literal->_M_dataplus)._M_p;
  sVar3 = literal->_M_string_length;
  for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
    bVar1 = puVar2[sVar4];
    CharClass<unsigned_char>::CharClass(&local_50,(uint)bVar1,(uint)bVar1 + L'\x01');
    origin = add_node(this,&local_50,origin,tag);
    CharClass<unsigned_char>::~CharClass(&local_50);
    tag = 0;
  }
  return origin;
}

Assistant:

int import_literal_terminal(const std::basic_string<TCHAR>& literal, int origin, int tag)
    {
        for (TCHAR ch : literal)
        {
            origin = add_node(CharClass<TCHAR>(ch, ch + 1), origin, tag);
            tag = 0;
        }
        return origin;
    }